

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::UniversalPrinter<std::optional<float>_>::Print
               (Optional<float> *value,ostream *os)

{
  char local_1a [2];
  
  local_1a[1] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1a + 1,1);
  if ((value->super__Optional_base<float,_true,_true>)._M_payload.
      super__Optional_payload_base<float>._M_engaged == false) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"nullopt",7);
  }
  else {
    std::ostream::_M_insert<double>
              ((double)(value->super__Optional_base<float,_true,_true>)._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value);
  }
  local_1a[0] = ')';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_1a,1);
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }